

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O3

int lj_cf_jit_profile_dumpstack(lua_State *L)

{
  TValue *pTVar1;
  int32_t depth;
  size_t in_RAX;
  GCstr *pGVar2;
  char *str;
  lua_State *L_00;
  uint uVar3;
  size_t len;
  size_t local_28;
  
  pTVar1 = L->base;
  uVar3 = 0;
  L_00 = L;
  if ((pTVar1 < L->top) && (uVar3 = 0, (pTVar1->field_2).it == 0xfffffff9)) {
    uVar3 = 1;
    L_00 = (lua_State *)(ulong)(pTVar1->u32).lo;
  }
  local_28 = in_RAX;
  pGVar2 = lj_lib_checkstr(L,uVar3 + 1);
  depth = lj_lib_checkint(L,uVar3 | 2);
  str = luaJIT_profile_dumpstack(L_00,(char *)(pGVar2 + 1),depth,&local_28);
  lua_pushlstring(L,str,local_28);
  return 1;
}

Assistant:

LJLIB_CF(jit_profile_dumpstack)
{
  lua_State *L2 = L;
  int arg = 0;
  size_t len;
  int depth;
  GCstr *fmt;
  const char *p;
  if (L->top > L->base && tvisthread(L->base)) {
    L2 = threadV(L->base);
    arg = 1;
  }
  fmt = lj_lib_checkstr(L, arg+1);
  depth = lj_lib_checkint(L, arg+2);
  p = luaJIT_profile_dumpstack(L2, strdata(fmt), depth, &len);
  lua_pushlstring(L, p, len);
  return 1;
}